

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SuffixWriterFactory>
          (ExampleNLFeeder *this,SuffixWriterFactory *swf)

{
  vector<double,_std::allocator<double>_> *vec;
  uint nnz;
  ExampleModel *pEVar1;
  char *pcVar2;
  SuffixIntWriter sw;
  SparseVectorWriter<int,_int> SStack_38;
  
  pEVar1 = this->mdl_;
  nnz = pEVar1->suf[0].kind_;
  vec = &pEVar1->suf[0].values_;
  if ((nnz & 4) == 0) {
    pcVar2 = pEVar1->suf[0].name_;
    CountNNZ<std::vector<double,std::allocator<double>>>(this,vec);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::SuffixWriterFactory::
    StartIntSuffix((SuffixWriterFactory *)&SStack_38,(char *)swf,(int)pcVar2,nnz);
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,int>,std::vector<double,std::allocator<double>>>
              (this,&SStack_38,&this->mdl_->suf[0].values_);
  }
  else {
    pcVar2 = pEVar1->suf[0].name_;
    CountNNZ<std::vector<double,std::allocator<double>>>(this,vec);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::SuffixWriterFactory::
    StartDblSuffix((SuffixWriterFactory *)&SStack_38,(char *)swf,(int)pcVar2,nnz);
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,std::vector<double,std::allocator<double>>>
              (this,(SparseVectorWriter<int,_double> *)&SStack_38,&this->mdl_->suf[0].values_);
  }
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (int i=0; i<Model().n_suf; ++i) {
      if (Model().suf[i].kind_ & 4) {     // double's
        auto sw = swf.StartDblSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      } else {                            // int's
        auto sw = swf.StartIntSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      }
    }
  }